

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint huffmanDecodeSymbol(uchar *in,size_t *bp,HuffmanTree *codetree,size_t inbitlength)

{
  uint uVar1;
  uint ct;
  uint treepos;
  size_t inbitlength_local;
  HuffmanTree *codetree_local;
  size_t *bp_local;
  uchar *in_local;
  
  treepos = 0;
  while( true ) {
    if (inbitlength <= *bp) {
      return 0xffffffff;
    }
    uVar1 = codetree->tree2d[treepos * 2 + ((int)(uint)in[*bp >> 3] >> ((byte)*bp & 7) & 1U)];
    *bp = *bp + 1;
    if (uVar1 < codetree->numcodes) break;
    treepos = uVar1 - codetree->numcodes;
    if (codetree->numcodes <= treepos) {
      return 0xffffffff;
    }
  }
  return uVar1;
}

Assistant:

static unsigned huffmanDecodeSymbol(const unsigned char* in, size_t* bp,
                                    const HuffmanTree* codetree, size_t inbitlength)
{
  unsigned treepos = 0, ct;
  for(;;)
  {
    if(*bp >= inbitlength) return (unsigned)(-1); /*error: end of input memory reached without endcode*/
    /*
    decode the symbol from the tree. The "readBitFromStream" code is inlined in
    the expression below because this is the biggest bottleneck while decoding
    */
    ct = codetree->tree2d[(treepos << 1) + READBIT(*bp, in)];
    ++(*bp);
    if(ct < codetree->numcodes) return ct; /*the symbol is decoded, return it*/
    else treepos = ct - codetree->numcodes; /*symbol not yet decoded, instead move tree position*/

    if(treepos >= codetree->numcodes) return (unsigned)(-1); /*error: it appeared outside the codetree*/
  }
}